

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

void lws_rx_flow_allow_all_protocol(lws_context *context,lws_protocols *protocol)

{
  lws *wsi_00;
  int local_30;
  uint local_2c;
  uint m;
  uint n;
  lws *wsi;
  lws_context_per_thread *pt;
  lws_protocols *protocol_local;
  lws_context *context_local;
  
  wsi = (lws *)context->pt;
  local_30 = (int)context->count_threads;
  while (local_30 != 0) {
    for (local_2c = 0; local_2c < *(uint *)&(wsi->dll_buflist).owner; local_2c = local_2c + 1) {
      wsi_00 = wsi_from_fd(context,*(int *)((wsi->sul_hrtimer).cb + (ulong)local_2c * 8));
      if ((wsi_00 != (lws *)0x0) && (wsi_00->protocol == protocol)) {
        lws_rx_flow_control(wsi_00,1);
      }
    }
    wsi = (lws *)&(wsi->same_vh_protocol).next;
    local_30 = local_30 + -1;
  }
  return;
}

Assistant:

void
lws_rx_flow_allow_all_protocol(const struct lws_context *context,
			       const struct lws_protocols *protocol)
{
	const struct lws_context_per_thread *pt = &context->pt[0];
	struct lws *wsi;
	unsigned int n, m = context->count_threads;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->protocol == protocol)
				lws_rx_flow_control(wsi, LWS_RXFLOW_ALLOW);
		}
		pt++;
	}
}